

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonReader.h
# Opt level: O0

void __thiscall Json::JsonReader::JsonReader(JsonReader *this,FILE *fp)

{
  int iVar1;
  char c;
  allocator<char> local_39;
  string local_38;
  FILE *local_18;
  FILE *fp_local;
  JsonReader *this_local;
  
  local_18 = (FILE *)fp;
  fp_local = (FILE *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  JsonReader(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (local_18 != (FILE *)0x0) {
    while( true ) {
      iVar1 = fgetc(local_18);
      if ((char)iVar1 == -1) break;
      std::__cxx11::string::operator+=((string *)this,(char)iVar1);
    }
    iVar1 = std::__cxx11::string::size();
    this->__len = iVar1;
  }
  return;
}

Assistant:

explicit JsonReader(FILE *fp) : JsonReader("") {
            if (fp) {
                char c;
                while ((c = fgetc(fp)) != EOF) __JSON += c;
                __len = __JSON.size();
            }
        }